

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PodVectorTests.cpp
# Opt level: O2

void __thiscall agge::tests::PODVectorTests::PODVectorTests(PODVectorTests *this)

{
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__NewVectorHasExpectedState_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__NewVectorHasExpectedState_meta>
              *)this);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingIncreasesSize_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingIncreasesSize_meta>
              *)&this->field_0x1);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingIncreasesSizeFromInitial_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingIncreasesSizeFromInitial_meta>
              *)&this->field_0x2);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__StateIsResetOnClear_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__StateIsResetOnClear_meta>
              *)&this->field_0x3);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__BufferIsPreservedOnClear_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__BufferIsPreservedOnClear_meta>
              *)&this->field_0x4);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendedValuesAreCopied_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendedValuesAreCopied_meta>
              *)&this->field_0x5);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__VectorIsIndexed_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__VectorIsIndexed_meta>
              *)&this->field_0x6);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__IndexedReferencesAreThoseActuallyStored_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__IndexedReferencesAreThoseActuallyStored_meta>
              *)&this->field_0x7);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__InitialCapacityEqualsToInitialSize_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__InitialCapacityEqualsToInitialSize_meta>
              *)&this->field_0x8);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingOverCapacityIncresesCapacityByHalfOfCurrent_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingOverCapacityIncresesCapacityByHalfOfCurrent_meta>
              *)&this->field_0x9);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__IncresingCapacityPreservesOldValuesAndPushesNew_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__IncresingCapacityPreservesOldValuesAndPushesNew_meta>
              *)&this->field_0xa);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__CopyingVectorCopiesElements_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__CopyingVectorCopiesElements_meta>
              *)&this->field_0xb);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizedVectorGuranteesItsRangeSize_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizedVectorGuranteesItsRangeSize_meta>
              *)&this->field_0xc);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizingToASmallerSizeDoesNotDecreaseCapacity_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizingToASmallerSizeDoesNotDecreaseCapacity_meta>
              *)&this->field_0xd);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizingToALargerSizeIncreaseCapacity_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizingToALargerSizeIncreaseCapacity_meta>
              *)&this->field_0xe);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizePreservesContent_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__ResizePreservesContent_meta>
              *)&this->field_0xf);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AssigningAValueResizesVectorToAppropriateSizeAndFillsIt_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AssigningAValueResizesVectorToAppropriateSizeAndFillsIt_meta>
              *)&this->field_0x10);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__PoppingLastElementReducesSize_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__PoppingLastElementReducesSize_meta>
              *)&this->field_0x11);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingReturnsIteratorToTheElementAppended_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__AppendingReturnsIteratorToTheElementAppended_meta>
              *)&this->field_0x12);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__SwappingVectorsOnlySwapsTheirBaseIterators_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__SwappingVectorsOnlySwapsTheirBaseIterators_meta>
              *)&this->field_0x13);
  ut::
  test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__NewEndIsReturnedAfterSetting_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::PODVectorTests,_&agge::tests::PODVectorTests::__NewEndIsReturnedAfterSetting_meta>
              *)&this->field_0x14);
  return;
}

Assistant:

test( NewVectorHasExpectedState )
			{
				// INIT / ACT
				pod_vector<char> empty1;
				pod_vector<double> empty2(0);
				pod_vector<A> As(10);
				const pod_vector<B> Bs(13211);

				// ACT / ASSERT
				assert_is_true(empty1.empty());
				assert_equal(0u, empty1.size());
				assert_equal(0u, empty1.capacity());
				assert_equal(empty1.end(), empty1.begin());
				assert_is_true(empty2.empty());
				assert_equal(0u, empty2.size());
				assert_equal(0u, empty2.capacity());
				assert_equal(empty2.end(), empty2.begin());

				assert_is_false(As.empty());
				assert_equal(10u, As.size());
				assert_is_true(10u <= As.capacity());
				assert_equal(10, As.end() - As.begin());
				assert_is_false(Bs.empty());
				assert_equal(13211u, Bs.size());
				assert_is_true(13211u <= Bs.capacity());
				assert_equal(13211, Bs.end() - Bs.begin());
			}